

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mip_level::set_alpha_to_luma(mip_level *this)

{
  component_flags cVar1;
  pixel_format pVar2;
  
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    unpack_from_dxt(this,false);
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma(this->m_pImage);
  cVar1 = this->m_pImage->m_comp_flags;
  this->m_comp_flags = cVar1;
  pVar2 = PIXEL_FMT_A8L8;
  if ((cVar1 & cCompFlagGrayscale) == 0) {
    pVar2 = PIXEL_FMT_A8R8G8B8;
  }
  this->m_format = pVar2;
  return true;
}

Assistant:

bool mip_level::set_alpha_to_luma() {
  if (m_pDXTImage)
    unpack_from_dxt(true);

  m_pImage->set_alpha_to_luma();

  m_comp_flags = m_pImage->get_comp_flags();

  if (m_pImage->is_grayscale())
    m_format = PIXEL_FMT_A8L8;
  else
    m_format = PIXEL_FMT_A8R8G8B8;

  return true;
}